

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O0

Timestamp *
google::protobuf::util::anon_unknown_0::CreateNormalized<google::protobuf::Timestamp>
          (Timestamp *__return_storage_ptr__,int64_t seconds,int32_t nanos)

{
  bool bVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  LogMessageFatal local_68 [19];
  Voidify local_55 [20];
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [19];
  Voidify local_1d;
  int32_t local_1c;
  int64_t iStack_18;
  int32_t nanos_local;
  int64_t seconds_local;
  Timestamp *result;
  
  local_41 = 0;
  local_1c = nanos;
  iStack_18 = seconds;
  seconds_local = (int64_t)__return_storage_ptr__;
  if (seconds < -0xe7791f700 || 0x3afff4417f < seconds) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,
               "seconds >= TimeUtil::kTimestampMinSeconds && seconds <= TimeUtil::kTimestampMaxSeconds"
              );
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
               ,0x31,local_40._M_len,local_40._M_str);
    local_41 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [49])"Timestamp seconds are outside of the valid range");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_1d,pLVar2);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  if ((local_1c < -999999999) || (999999999 < local_1c)) {
    iStack_18 = local_1c / 1000000000 + iStack_18;
    local_1c = local_1c % 1000000000;
  }
  if (local_1c < 0) {
    iStack_18 = iStack_18 + -1;
    local_1c = local_1c + 1000000000;
  }
  bVar1 = false;
  if (((-0xe7791f701 < iStack_18) && (bVar1 = false, iStack_18 < 0x3afff44180)) &&
     (bVar1 = false, -1 < local_1c)) {
    bVar1 = local_1c < 1000000000;
  }
  if (bVar1) {
    Timestamp::Timestamp(__return_storage_ptr__);
    Timestamp::set_seconds(__return_storage_ptr__,iStack_18);
    Timestamp::set_nanos(__return_storage_ptr__,local_1c);
    return __return_storage_ptr__;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_78,
             "seconds >= TimeUtil::kTimestampMinSeconds && seconds <= TimeUtil::kTimestampMaxSeconds && nanos >= TimeUtil::kTimestampMinNanoseconds && nanos <= TimeUtil::kTimestampMaxNanoseconds"
            );
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
             ,0x42,local_78._M_len,local_78._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [40])"Timestamp is outside of the valid range");
  absl::lts_20240722::log_internal::Voidify::operator&&(local_55,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
}

Assistant:

Timestamp CreateNormalized(int64_t seconds, int32_t nanos) {
  ABSL_DCHECK(seconds >= TimeUtil::kTimestampMinSeconds &&
              seconds <= TimeUtil::kTimestampMaxSeconds)
      << "Timestamp seconds are outside of the valid range";

  // Make sure nanos is in the range.
  if (nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    seconds += nanos / kNanosPerSecond;
    nanos = nanos % kNanosPerSecond;
  }
  // For Timestamp nanos should be in the range [0, 999999999]
  if (nanos < 0) {
    seconds -= 1;
    nanos += kNanosPerSecond;
  }

  ABSL_DCHECK(seconds >= TimeUtil::kTimestampMinSeconds &&
              seconds <= TimeUtil::kTimestampMaxSeconds &&
              nanos >= TimeUtil::kTimestampMinNanoseconds &&
              nanos <= TimeUtil::kTimestampMaxNanoseconds)
      << "Timestamp is outside of the valid range";
  Timestamp result;
  result.set_seconds(seconds);
  result.set_nanos(static_cast<int32_t>(nanos));
  return result;
}